

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_simple.c
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ALLEGRO_SAMPLE_ID sample_id;
  ALLEGRO_SAMPLE_ID new_sample_id;
  long local_c8 [10];
  ALLEGRO_EVENT event;
  
  cVar6 = al_install_system(0x85020700,atexit);
  if (cVar6 == '\0') {
    pcVar13 = "Could not init Allegro.\n";
  }
  else {
    if (argc < 2) {
      lVar8 = 0;
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n",
                 *argv);
LAB_00102792:
      al_destroy_display(lVar8);
      return 0;
    }
    al_install_keyboard();
    lVar8 = al_create_display(0x280,0x1e0);
    if (lVar8 == 0) {
      pcVar13 = "Could not create display\n";
    }
    else {
      uVar15 = argc - 1;
      uVar9 = al_create_timer(0x11111111);
      al_start_timer(uVar9);
      uVar10 = al_create_event_queue();
      uVar11 = al_get_keyboard_event_source();
      al_register_event_source(uVar10,uVar11);
      uVar11 = al_get_display_event_source(lVar8);
      al_register_event_source(uVar10,uVar11);
      uVar9 = al_get_timer_event_source(uVar9);
      al_register_event_source(uVar10,uVar9);
      al_init_acodec_addon();
      uVar14 = 10;
      if (uVar15 < 10) {
        uVar14 = (ulong)uVar15;
      }
      bVar4 = false;
      bVar3 = false;
      while (cVar6 = al_install_audio(), cVar6 != '\0') {
        cVar6 = al_reserve_samples(0x10);
        if (cVar6 == '\0') {
          pcVar13 = "Could not set up voice and mixer.\n";
          goto LAB_001027d0;
        }
        local_c8[8] = 0;
        local_c8[9] = 0;
        local_c8[6] = 0;
        local_c8[7] = 0;
        local_c8[4] = 0;
        local_c8[5] = 0;
        local_c8[2] = 0;
        local_c8[3] = 0;
        local_c8[0] = 0;
        local_c8[1] = 0;
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          pcVar13 = argv[uVar16 + 1];
          lVar12 = al_load_sample(pcVar13);
          local_c8[uVar16] = lVar12;
          if (lVar12 == 0) {
            log_printf("Could not load sample from \'%s\'!\n",pcVar13);
          }
        }
        log_printf(
                  "Press digits to play sounds.\nSpace to stop sounds.\nAdd Alt to play sounds repeatedly.\n\'p\' to pan the last played sound.\nEscape to quit.\n"
                  );
        do {
          do {
            while( true ) {
              al_wait_for_event(uVar10);
              if (event.type != 0x1e) break;
              if ((bVar3) && (bVar4)) {
                lVar12 = al_lock_sample_id(&sample_id);
                if (lVar12 != 0) {
                  dVar1 = (double)al_get_time();
                  dVar1 = sin(dVar1);
                  al_set_sample_instance_pan((float)dVar1,lVar12);
                }
                al_unlock_sample_id(&sample_id);
              }
            }
            if (event.type == 0x2a) {
LAB_00102761:
              for (uVar14 = 0; ((long)uVar14 < (long)(int)uVar15 && (uVar14 < 10));
                  uVar14 = uVar14 + 1) {
                if (local_c8[uVar14] != 0) {
                  al_destroy_sample();
                }
              }
              al_uninstall_audio();
              goto LAB_00102792;
            }
          } while (event.type != 0xb);
          if (event.display.width == 0x3b) goto LAB_00102761;
          if (event.display.height == 0x20) {
            log_printf("Stopping all sounds\n");
            al_stop_samples();
          }
          uVar5 = event.display.orientation;
          if (event.display.height - 0x30U < 10) {
            uVar2 = event.display.height - 0x31;
            if (event.display.height - 0x27U < 10) {
              uVar2 = event.display.height - 0x27U;
            }
            if (local_c8[uVar2] != 0) {
              cVar6 = al_play_sample(0x3f800000,0,0x3f800000,local_c8[uVar2],
                                     0x101 - (uint)((event.keyboard.modifiers & 4) == 0),
                                     &new_sample_id);
              if (cVar6 == '\0') {
                log_printf("al_play_sample_data failed, perhaps too many sounds\n");
              }
              else {
                pcVar13 = "repeatedly";
                if ((uVar5 & 4) == 0) {
                  pcVar13 = "once";
                }
                log_printf("Playing %d %s\n",(ulong)uVar2,pcVar13);
                if (!bVar3) {
                  sample_id = new_sample_id;
                  bVar4 = true;
                }
              }
              goto LAB_001026fd;
            }
          }
          else {
LAB_001026fd:
            if ((event.display.height == 0x70) && (bVar4)) {
              pcVar13 = "Panning\n";
              if (bVar3) {
                pcVar13 = "Not panning\n";
              }
              log_printf(pcVar13);
              bVar3 = (bool)(bVar3 ^ 1);
            }
          }
        } while (event.display.height != 0x72);
        for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
          if (local_c8[uVar16] != 0) {
            al_destroy_sample();
          }
        }
        al_uninstall_audio();
      }
      pcVar13 = "Could not init sound!\n";
    }
  }
LAB_001027d0:
  abort_example(pcVar13);
  iVar7 = __cxa_atexit();
  return iVar7;
}

Assistant:

int main(int argc, const char *argv[])
{
   ALLEGRO_SAMPLE *sample_data[MAX_SAMPLE_DATA] = {NULL};
   ALLEGRO_DISPLAY *display = NULL;
   ALLEGRO_EVENT_QUEUE *event_queue;
   ALLEGRO_EVENT event;
   ALLEGRO_SAMPLE_ID sample_id;
   bool sample_id_valid = false;
   ALLEGRO_TIMER* timer;
   int i;
   bool panning = false;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\nUsage: %s {audio_files}\n", argv[0]);
      goto done;
   }
   argc--;
   argv++;

   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Could not create display\n");
   }

   timer = al_create_timer(1/60.0);
   al_start_timer(timer);
   event_queue = al_create_event_queue();
   al_register_event_source(event_queue, al_get_keyboard_event_source());
   al_register_event_source(event_queue, al_get_display_event_source(display));
   al_register_event_source(event_queue, al_get_timer_event_source(timer));

   al_init_acodec_addon();

Restart:

   if (!al_install_audio()) {
      abort_example("Could not init sound!\n");
   }

   if (!al_reserve_samples(RESERVED_SAMPLES)) {
      abort_example("Could not set up voice and mixer.\n");
   }

   memset(sample_data, 0, sizeof(sample_data));
   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      const char *filename = argv[i];

      /* Load the entire sound file from disk. */
      sample_data[i] = al_load_sample(argv[i]);
      if (!sample_data[i]) {
         log_printf("Could not load sample from '%s'!\n", filename);
         continue;
      }
   }

   log_printf(
      "Press digits to play sounds.\n"
      "Space to stop sounds.\n"
      "Add Alt to play sounds repeatedly.\n"
      "'p' to pan the last played sound.\n"
      "Escape to quit.\n");

   while (true) {
      al_wait_for_event(event_queue, &event);
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         if (event.keyboard.unichar == ' ') {
            log_printf("Stopping all sounds\n");
            al_stop_samples();
         }

         if (event.keyboard.unichar >= '0' && event.keyboard.unichar <= '9') {
            bool loop = event.keyboard.modifiers & ALLEGRO_KEYMOD_ALT;
            i = (event.keyboard.unichar - '0' + 9) % 10;
            if (sample_data[i]) {
               ALLEGRO_SAMPLE_ID new_sample_id;
               bool ret = al_play_sample(sample_data[i], 1.0, 0.0, 1.0,
                  loop ? ALLEGRO_PLAYMODE_LOOP : ALLEGRO_PLAYMODE_ONCE, &new_sample_id);
               if (ret) {
                  log_printf("Playing %d %s\n", i, loop ? "repeatedly" : "once");
               }
               else {
                  log_printf(
                     "al_play_sample_data failed, perhaps too many sounds\n");
               }
               if (!panning) {
                  if (ret) {
                     sample_id = new_sample_id;
                     sample_id_valid = true;
                  }
               }
            }
         }

         if (event.keyboard.unichar == 'p') {
            if (sample_id_valid) {
               panning = !panning;
               if (panning) {
                  log_printf("Panning\n");
               }
               else {
                  log_printf("Not panning\n");
               }
            }
         }

         /* Hidden feature: restart audio subsystem.
          * For debugging race conditions on shutting down the audio.
          */
         if (event.keyboard.unichar == 'r') {
            for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
               if (sample_data[i])
                  al_destroy_sample(sample_data[i]);
            }
            al_uninstall_audio();
            goto Restart;
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (event.type == ALLEGRO_EVENT_TIMER) {
         if (panning && sample_id_valid) {
            ALLEGRO_SAMPLE_INSTANCE* instance = al_lock_sample_id(&sample_id);
            if (instance) {
               al_set_sample_instance_pan(instance, sin(al_get_time()));
            }
            al_unlock_sample_id(&sample_id);
         }
      }
   }

   for (i = 0; i < argc && i < MAX_SAMPLE_DATA; i++) {
      if (sample_data[i])
         al_destroy_sample(sample_data[i]);
   }

   /* Sample data and other objects will be automatically freed. */
   al_uninstall_audio();

done:
   al_destroy_display(display);
   close_log(false);
   return 0;
}